

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::open(QFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  QFlags<QIODeviceBase::OpenModeFlag> QVar2;
  int iVar3;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar4;
  QFilePrivate *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  undefined1 auVar5 [12];
  FileError err;
  QFilePrivate *d;
  undefined4 in_stack_ffffffffffffff18;
  OpenModeFlag in_stack_ffffffffffffff1c;
  enum_type in_stack_ffffffffffffff20;
  enum_type in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  bool local_61;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_48;
  uint local_44;
  QMessageLogger local_40;
  CompareAgainstLiteralZero local_1d;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_1c;
  int local_18;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_14;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_14.i = (Int)__file;
  local_18 = __oflag;
  this_00 = d_func((QFile *)0x2a602e);
  bVar1 = QIODevice::isOpen((QIODevice *)
                            CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  if (bVar1) {
    local_61 = file_already_open((QFile *)CONCAT44(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60),
                                 in_stack_ffffffffffffff58);
  }
  else {
    ::operator|(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
    local_1c.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
         (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
         QFlags<QIODeviceBase::OpenModeFlag>::operator&
                   ((QFlags<QIODeviceBase::OpenModeFlag> *)
                    CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                    SUB84(in_stack_ffffffffffffff28,0));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
    if (bVar1) {
      QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_14,WriteOnly);
    }
    QFileDevice::unsetError
              ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    ::operator|(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20);
    QVar2 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                      ((QFlags<QIODeviceBase::OpenModeFlag> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                       SUB84(in_stack_ffffffffffffff28,0));
    QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1d,0);
    bVar1 = ::operator==(QVar2.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                         super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                 (char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QMessageLogger::warning(&local_40,"QIODevice::open: File access not specified");
      local_61 = false;
    }
    else {
      iVar3 = (*(this_00->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
                super_QObjectData._vptr_QObjectData[7])();
      QVar4.i = (Int)QFlags<QIODeviceBase::OpenModeFlag>::operator|
                               ((QFlags<QIODeviceBase::OpenModeFlag> *)
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                in_stack_ffffffffffffff1c);
      std::optional<QFlags<QFileDevice::Permission>_>::
      optional<QFlags<QFileDevice::Permission>_&,_true>
                ((optional<QFlags<QFileDevice::Permission>_> *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (QFlags<QFileDevice::Permission> *)
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      auVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
                         ((long *)CONCAT44(extraout_var,iVar3),QVar4.i,local_10);
      if ((auVar5 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a6232);
        QAbstractFileEngine::error
                  ((QAbstractFileEngine *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
                  ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                   0x2a626b);
        QAbstractFileEngine::errorString((QAbstractFileEngine *)this_00);
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c,(QString *)0x2a6293);
        QString::~QString((QString *)0x2a62a2);
        local_61 = false;
      }
      else {
        local_44 = local_14.i;
        QIODevice::open((QIODevice *)this,(char *)(ulong)local_14.i,auVar5._8_4_);
        local_48.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
             (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
             QFlags<QIODeviceBase::OpenModeFlag>::operator&
                       ((QFlags<QIODeviceBase::OpenModeFlag> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
        bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_48);
        if (bVar1) {
          iVar3 = (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x10])();
          (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x11])
                    (this,CONCAT44(extraout_var_00,iVar3));
        }
        local_61 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_61);
  }
  __stack_chk_fail();
}

Assistant:

bool QFile::open(OpenMode mode, QFile::Permissions permissions)
{
    Q_D(QFile);
    if (isOpen())
        return file_already_open(*this);
    // Either Append or NewOnly implies WriteOnly
    if (mode & (Append | NewOnly))
        mode |= WriteOnly;
    unsetError();
    if ((mode & (ReadOnly | WriteOnly)) == 0) {
        qWarning("QIODevice::open: File access not specified");
        return false;
    }

    // QIODevice provides the buffering, so there's no need to request it from the file engine.
    if (d->engine()->open(mode | QIODevice::Unbuffered, permissions)) {
        QIODevice::open(mode);
        if (mode & Append)
            seek(size());
        return true;
    }
    QFile::FileError err = d->fileEngine->error();
    if (err == QFile::UnspecifiedError)
        err = QFile::OpenError;
    d->setError(err, d->fileEngine->errorString());
    return false;
}